

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

string * __thiscall
duckdb_re2::DFA::DumpWorkq_abi_cxx11_(string *__return_storage_ptr__,DFA *this,Workq *q)

{
  char *pcVar1;
  int *piVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(int *)&this->prog_ != 0) {
    piVar2 = *(int **)((long)&(this->mutex_).mutex_ + 0x10);
    pcVar1 = anon_var_dwarf_4ed193b + 9;
    do {
      if (*piVar2 < (this->mutex_).mutex_.__data.__cur_writer) {
        StringPrintf_abi_cxx11_(&local_50,"%s%d",pcVar1);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pcVar1 = ",";
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pcVar1 = anon_var_dwarf_4ed193b + 9;
      }
      piVar2 = piVar2 + 1;
    } while (piVar2 != (int *)((long)*(int *)&this->prog_ * 4 +
                              *(long *)((long)&(this->mutex_).mutex_ + 0x10)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpWorkq(Workq* q) {
  std::string s;
  const char* sep = "";
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      s += "|";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}